

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,AtomicLoadExpr *expr)

{
  Module *pMVar1;
  Memory *memory_00;
  Enum EVar2;
  Index IVar3;
  const_reference ppMVar4;
  Newline local_c5;
  Type local_c4;
  StackVar local_bc;
  ExternalInstancePtr local_b0;
  Type local_9c;
  StackVar local_94;
  Type local_88;
  Type result_type;
  string local_60;
  Memory *local_40;
  Memory *memory;
  string func;
  AtomicLoadExpr *expr_local;
  CWriter *this_local;
  
  func.field_2._8_8_ = expr;
  std::__cxx11::string::string((string *)&memory);
  EVar2 = Opcode::operator_cast_to_Enum((Opcode *)(func.field_2._8_8_ + 0x88));
  switch(EVar2) {
  case I32AtomicLoad:
    std::__cxx11::string::operator=((string *)&memory,"i32_atomic_load");
    break;
  case I64AtomicLoad:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_load");
    break;
  case I32AtomicLoad8U:
    std::__cxx11::string::operator=((string *)&memory,"i32_atomic_load8_u");
    break;
  case I32AtomicLoad16U:
    std::__cxx11::string::operator=((string *)&memory,"i32_atomic_load16_u");
    break;
  case I64AtomicLoad8U:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_load8_u");
    break;
  case I64AtomicLoad16U:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_load16_u");
    break;
  case I64AtomicLoad32U:
    std::__cxx11::string::operator=((string *)&memory,"i64_atomic_load32_u");
    break;
  default:
    abort();
  }
  pMVar1 = this->module_;
  IVar3 = Module::GetMemoryIndex(this->module_,(Var *)(func.field_2._8_8_ + 0x40));
  ppMVar4 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::operator[]
                      (&pMVar1->memories,(ulong)IVar3);
  memory_00 = *ppMVar4;
  local_40 = memory_00;
  std::__cxx11::string::string((string *)&result_type,(string *)&memory);
  GetMemoryAPIString(&local_60,memory_00,(string *)&result_type);
  std::__cxx11::string::operator=((string *)&memory,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&result_type);
  local_9c = Opcode::GetResultType((Opcode *)(func.field_2._8_8_ + 0x88));
  local_88 = local_9c;
  StackVar::StackVar(&local_94,0,local_9c);
  ExternalInstancePtr::GlobalName(&local_b0,Memory,&local_40->name);
  Type::Type(&local_c4,Any);
  StackVar::StackVar(&local_bc,0,local_c4);
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[4],std::__cxx11::string&,char_const(&)[2],wabt::(anonymous_namespace)::ExternalInstancePtr,char_const(&)[9],wabt::(anonymous_namespace)::StackVar,char_const(&)[2]>
            ((CWriter *)this,&local_94,(char (*) [4])0x37cd5f,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&memory,
             (char (*) [2])0x37d6a1,&local_b0,(char (*) [9])", (u64)(",&local_bc,
             (char (*) [2])0x371d65);
  if (*(long *)(func.field_2._8_8_ + 0x98) != 0) {
    (anonymous_namespace)::CWriter::Write<char_const(&)[4],unsigned_long_const&,char_const(&)[2]>
              ((CWriter *)this,(char (*) [4])" + ",(unsigned_long *)(func.field_2._8_8_ + 0x98),
               (char (*) [2])0x375638);
  }
  (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [3])0x37d78e,&local_c5);
  DropTypes(this,1);
  PushType(this,local_88);
  std::__cxx11::string::~string((string *)&memory);
  return;
}

Assistant:

void CWriter::Write(const AtomicLoadExpr& expr) {
  std::string func;
  // clang-format off
  switch (expr.opcode) {
    case Opcode::I32AtomicLoad: func = "i32_atomic_load"; break;
    case Opcode::I64AtomicLoad: func = "i64_atomic_load"; break;
    case Opcode::I32AtomicLoad8U: func = "i32_atomic_load8_u"; break;
    case Opcode::I64AtomicLoad8U: func = "i64_atomic_load8_u"; break;
    case Opcode::I32AtomicLoad16U: func = "i32_atomic_load16_u"; break;
    case Opcode::I64AtomicLoad16U: func = "i64_atomic_load16_u"; break;
    case Opcode::I64AtomicLoad32U: func = "i64_atomic_load32_u"; break;

    default:
      WABT_UNREACHABLE;
  }
  // clang-format on

  Memory* memory = module_->memories[module_->GetMemoryIndex(expr.memidx)];
  func = GetMemoryAPIString(*memory, func);

  Type result_type = expr.opcode.GetResultType();
  Write(StackVar(0, result_type), " = ", func, "(",
        ExternalInstancePtr(ModuleFieldType::Memory, memory->name), ", (u64)(",
        StackVar(0), ")");
  if (expr.offset != 0)
    Write(" + ", expr.offset, "u");
  Write(");", Newline());
  DropTypes(1);
  PushType(result_type);
}